

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O1

void chrono::fea::ChMatrixCorotation::ComputeKCt
               (ChMatrixConstRef K,
               vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               *R,int nblocks,ChMatrixRef *KC)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  ulong local_50;
  
  uVar5 = 0;
  if (0 < nblocks) {
    ppCVar2 = (R->
              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (K->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    uVar7 = (uint)lVar3;
    lVar9 = 0;
    local_50 = 0;
    do {
      if (0 < (int)uVar7) {
        pdVar4 = (double *)ppCVar2[local_50];
        lVar13 = 0;
        uVar11 = 0;
        do {
          lVar6 = 0;
          pdVar12 = pdVar4;
          do {
            if (lVar3 <= (long)uVar11) {
LAB_0062afc6:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            uVar10 = (K->
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     ).
                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_cols.m_value;
            if ((long)uVar10 <= (long)uVar5) {
              uVar10 = uVar5;
            }
            auVar14 = ZEXT864(0) << 0x40;
            lVar8 = 0;
            do {
              if (uVar10 - uVar5 < 3) goto LAB_0062afc6;
              auVar15._8_8_ = 0;
              auVar15._0_8_ =
                   *(ulong *)((long)(K->
                                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                    ).
                                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                    .m_data +
                             lVar8 * 8 +
                             (K->
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).m_stride.m_outer.m_value * lVar13 + lVar9);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar12[lVar8];
              auVar1 = vfmadd231sd_fma(auVar14._0_16_,auVar15,auVar1);
              auVar14 = ZEXT1664(auVar1);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            if (((KC->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value <= (long)uVar11) ||
               (lVar8 = lVar6 + local_50 * 3,
               (KC->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar8)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                           );
            }
            (KC->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data[lVar8 + (KC->
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                            ).m_stride.m_outer.m_value * uVar11] = auVar1._0_8_;
            lVar6 = lVar6 + 1;
            pdVar12 = pdVar12 + 3;
          } while (lVar6 != 3);
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar11 != (~((int)uVar7 >> 0x1f) & uVar7));
      }
      local_50 = local_50 + 1;
      uVar5 = (ulong)((int)uVar5 + 3);
      lVar9 = lVar9 + 0x18;
    } while (local_50 != (uint)nblocks);
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeKCt(ChMatrixConstRef K,                   // matrix to corotate
                                    const std::vector<ChMatrix33<>*>& R,  // 3x3 rotation matrices (used transposed)
                                    const int nblocks,                    // number of rotation blocks
                                    ChMatrixRef KC                        // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        const ChMatrix33<>* mR = R[iblock];

        double sum;
        for (int rowres = 0; rowres < (int)K.rows(); ++rowres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += K(rowres, col + (3 * iblock)) * (*mR)(row, col);
                KC(rowres, row + (3 * iblock)) = sum;
            }
    }
}